

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

int __thiscall
QListModeViewBase::perItemScrollToValue
          (QListModeViewBase *this,int index,int scrollValue,int viewportSize,ScrollHint hint,
          Orientation orientation,bool wrap,int itemExtent)

{
  uint uVar1;
  QListViewPrivate *this_00;
  int *piVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  iterator iVar8;
  iterator iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  undefined1 *puVar15;
  int iVar16;
  uint uVar17;
  int *piVar18;
  int iVar19;
  int iVar20;
  long in_FS_OFFSET;
  QList<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (index < 0) goto LAB_0057bd84;
  this_00 = (this->super_QCommonListViewBase).dd;
  iVar19 = itemExtent + this_00->space;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QListViewPrivate::hiddenRowIds(&local_58,this_00);
  iVar8 = QList<int>::begin(&local_58);
  iVar9 = QList<int>::end(&local_58);
  if (iVar8.i != iVar9.i) {
    uVar10 = (long)iVar9.i - (long)iVar8.i >> 2;
    lVar14 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::__introsort_loop<QList<int>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar8.i,iVar9.i,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>();
  }
  uVar6 = 0;
  if ((undefined1 *)0x1 < (ulong)local_58.d.size) {
    puVar15 = (undefined1 *)0x0;
    do {
      uVar6 = (uint)puVar15;
      if ((int)(index + (uint)puVar15) < local_58.d.ptr[(long)puVar15]) break;
      puVar15 = puVar15 + 1;
      uVar6 = (int)local_58.d.size - 1;
    } while ((undefined1 *)(local_58.d.size + -1) != puVar15);
  }
  if (wrap) {
    if (Vertical - (((this->super_QCommonListViewBase).dd)->flow == LeftToRight) == orientation) {
      iVar12 = (this->flowPositions).d.ptr[uVar6 + index];
    }
    else {
      uVar10 = (this->segmentStartRows).d.size;
      bVar3 = true;
      if (uVar10 == 0) {
LAB_0057bd28:
        iVar12 = (int)uVar10;
        goto LAB_0057bd5a;
      }
      iVar12 = (int)uVar10 + -1;
      uVar10 = (ulong)(uint)((int)uVar10 >> 1);
      if (0 < iVar12) {
        iVar20 = 0;
        do {
          iVar16 = (int)uVar10;
          if (index < (this->segmentStartRows).d.ptr[iVar16]) {
            iVar12 = iVar16 + -1;
            iVar16 = iVar20;
          }
          uVar10 = (ulong)(uint)(iVar12 + iVar16 + 1 >> 1);
          iVar20 = iVar16;
        } while (iVar16 < iVar12);
      }
      iVar20 = (int)uVar10;
      lVar14 = (long)iVar20;
      piVar18 = (this->segmentPositions).d.ptr;
      piVar2 = piVar18 + lVar14;
      uVar13 = (ulong)(uint)scrollValue;
      if (iVar20 < scrollValue) {
        uVar13 = uVar10;
      }
      do {
        iVar12 = (int)uVar13;
        if (lVar14 <= scrollValue) goto LAB_0057bd0d;
        lVar4 = lVar14 + -1;
        lVar14 = lVar14 + -1;
      } while ((iVar19 + *piVar2) - piVar18[lVar4] <= viewportSize);
      iVar12 = (int)lVar14 + 1;
LAB_0057bd0d:
      if (hint == PositionAtCenter) {
        iVar12 = iVar20 - (((iVar20 - iVar12) - ((iVar20 - iVar12) + 1 >> 0x1f)) + 1 >> 1);
      }
      else {
        if (hint == PositionAtBottom) {
          bVar3 = false;
          goto LAB_0057bd5a;
        }
        iVar12 = iVar20;
        if (hint != PositionAtTop) goto LAB_0057bd28;
      }
    }
    bVar3 = false;
  }
  else {
    iVar12 = index;
    if (index != 0) {
      piVar2 = (this->flowPositions).d.ptr;
      uVar1 = uVar6 + index;
      iVar20 = 1;
      if (index < 1) {
        iVar20 = index;
      }
      iVar16 = index + -1;
      iVar11 = index;
      do {
        iVar12 = iVar11;
        if (viewportSize < (iVar19 + piVar2[uVar1]) - piVar2[(long)(int)(uVar6 + iVar11) + -1])
        break;
        uVar17 = (int)uVar6 >> 0x1f & uVar6;
        piVar18 = local_58.d.ptr + ((ulong)uVar6 - 1);
        uVar5 = uVar6;
        do {
          uVar7 = uVar5;
          uVar6 = uVar17;
          if ((int)uVar7 < 1) break;
          iVar12 = *piVar18;
          piVar18 = piVar18 + -1;
          uVar5 = uVar7 - 1;
          uVar6 = uVar7;
        } while ((int)(iVar16 + uVar7 + -1) <= iVar12);
        iVar16 = iVar16 + -1;
        bVar3 = 1 < iVar11;
        iVar11 = iVar11 + -1;
        iVar12 = iVar20 + -1;
      } while (bVar3);
    }
    if (hint == PositionAtCenter) {
      index = index - (((index - iVar12) - ((index - iVar12) + 1 >> 0x1f)) + 1 >> 1);
LAB_0057bd46:
      bVar3 = false;
      iVar12 = index;
    }
    else if (hint == PositionAtBottom) {
      bVar3 = false;
    }
    else {
      if (hint == PositionAtTop) goto LAB_0057bd46;
      bVar3 = true;
      iVar12 = index;
    }
  }
LAB_0057bd5a:
  if (bVar3) {
    iVar12 = scrollValue;
  }
  scrollValue = iVar12;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
    }
  }
LAB_0057bd84:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return scrollValue;
}

Assistant:

int QListModeViewBase::perItemScrollToValue(int index, int scrollValue, int viewportSize,
                                                 QAbstractItemView::ScrollHint hint,
                                                 Qt::Orientation orientation, bool wrap, int itemExtent) const
{
    if (index < 0)
        return scrollValue;

    itemExtent += spacing();
    QList<int> hiddenRows = dd->hiddenRowIds();
    std::sort(hiddenRows.begin(), hiddenRows.end());
    int hiddenRowsBefore = 0;
    for (int i = 0; i < hiddenRows.size() - 1; ++i)
        if (hiddenRows.at(i) > index + hiddenRowsBefore)
            break;
        else
            ++hiddenRowsBefore;
    if (!wrap) {
        int topIndex = index;
        const int bottomIndex = topIndex;
        const int bottomCoordinate = flowPositions.at(index + hiddenRowsBefore);
        while (topIndex > 0 &&
               (bottomCoordinate - flowPositions.at(topIndex + hiddenRowsBefore - 1) + itemExtent) <= (viewportSize)) {
            topIndex--;
            // will the next one be a hidden row -> skip
            while (hiddenRowsBefore > 0 && hiddenRows.at(hiddenRowsBefore - 1) >= topIndex + hiddenRowsBefore - 1)
                hiddenRowsBefore--;
        }

        const int itemCount = bottomIndex - topIndex + 1;
        switch (hint) {
        case QAbstractItemView::PositionAtTop:
            return index;
        case QAbstractItemView::PositionAtBottom:
            return index - itemCount + 1;
        case QAbstractItemView::PositionAtCenter:
            return index - (itemCount / 2);
        default:
            break;
        }
    } else { // wrapping
        Qt::Orientation flowOrientation = (flow() == QListView::LeftToRight
                                           ? Qt::Horizontal : Qt::Vertical);
        if (flowOrientation == orientation) { // scrolling in the "flow" direction
            // ### wrapped scrolling in the flow direction
            return flowPositions.at(index + hiddenRowsBefore); // ### always pixel based for now
        } else if (!segmentStartRows.isEmpty()) { // we are scrolling in the "segment" direction
            int segment = qBinarySearch<int>(segmentStartRows, index, 0, segmentStartRows.size() - 1);
            int leftSegment = segment;
            const int rightSegment = leftSegment;
            const int bottomCoordinate = segmentPositions.at(segment);

            while (leftSegment > scrollValue &&
                (bottomCoordinate - segmentPositions.at(leftSegment-1) + itemExtent) <= (viewportSize)) {
                    leftSegment--;
            }

            const int segmentCount = rightSegment - leftSegment + 1;
            switch (hint) {
            case QAbstractItemView::PositionAtTop:
                return segment;
            case QAbstractItemView::PositionAtBottom:
                return segment - segmentCount + 1;
            case QAbstractItemView::PositionAtCenter:
                return segment - (segmentCount / 2);
            default:
                break;
            }
        }
    }
    return scrollValue;
}